

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void do_vararg_push(dill_stream_conflict s,char *arg_str,__va_list_tag *ap)

{
  uint uVar1;
  double *pdVar2;
  uint *in_RDX;
  dill_stream in_RDI;
  int arg;
  type_union value [256];
  arg_info_list args;
  int reverse;
  int arg_count;
  int i;
  double *local_910;
  int *in_stack_fffffffffffff710;
  char *in_stack_fffffffffffff718;
  double *local_8d0;
  double *local_8b8;
  double *local_8a0;
  undefined4 *local_888;
  undefined4 *local_870;
  undefined4 *local_850;
  int local_83c;
  double adStack_838 [257];
  arg_info_list local_30;
  int local_24;
  int local_20;
  int local_1c;
  uint *local_18;
  dill_stream local_8;
  
  local_24 = 0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_30 = translate_arg_str(in_stack_fffffffffffff718,in_stack_fffffffffffff710);
  (*local_8->j->push)(local_8,0xb,-1);
  local_24 = dill_do_reverse_vararg_push(local_8);
  for (local_1c = 0; local_1c < local_20; local_1c = local_1c + 1) {
    if (local_30[local_1c].is_immediate == '\0') {
      uVar1 = *local_18;
      if (uVar1 < 0x29) {
        local_850 = (undefined4 *)((long)(int)uVar1 + *(long *)(local_18 + 4));
        *local_18 = uVar1 + 8;
      }
      else {
        local_850 = *(undefined4 **)(local_18 + 2);
        *(undefined4 **)(local_18 + 2) = local_850 + 2;
      }
      *(undefined4 *)(adStack_838 + local_1c) = *local_850;
    }
    else {
      switch(local_30[local_1c].type) {
      case '\0':
      case '\x02':
      case '\x04':
        uVar1 = *local_18;
        if (uVar1 < 0x29) {
          local_888 = (undefined4 *)((long)(int)uVar1 + *(long *)(local_18 + 4));
          *local_18 = uVar1 + 8;
        }
        else {
          local_888 = *(undefined4 **)(local_18 + 2);
          *(undefined4 **)(local_18 + 2) = local_888 + 2;
        }
        *(undefined4 *)(adStack_838 + local_1c) = *local_888;
        break;
      case '\x01':
      case '\x03':
      case '\x05':
        uVar1 = *local_18;
        if (uVar1 < 0x29) {
          local_870 = (undefined4 *)((long)(int)uVar1 + *(long *)(local_18 + 4));
          *local_18 = uVar1 + 8;
        }
        else {
          local_870 = *(undefined4 **)(local_18 + 2);
          *(undefined4 **)(local_18 + 2) = local_870 + 2;
        }
        *(undefined4 *)(adStack_838 + local_1c) = *local_870;
        break;
      case '\x06':
        uVar1 = *local_18;
        if (uVar1 < 0x29) {
          local_8a0 = (double *)((long)(int)uVar1 + *(long *)(local_18 + 4));
          *local_18 = uVar1 + 8;
        }
        else {
          local_8a0 = *(double **)(local_18 + 2);
          *(double **)(local_18 + 2) = local_8a0 + 1;
        }
        adStack_838[local_1c] = *local_8a0;
        break;
      case '\a':
        uVar1 = *local_18;
        if (uVar1 < 0x29) {
          local_8b8 = (double *)((long)(int)uVar1 + *(long *)(local_18 + 4));
          *local_18 = uVar1 + 8;
        }
        else {
          local_8b8 = *(double **)(local_18 + 2);
          *(double **)(local_18 + 2) = local_8b8 + 1;
        }
        adStack_838[local_1c] = *local_8b8;
        break;
      case '\b':
        uVar1 = *local_18;
        if (uVar1 < 0x29) {
          local_8d0 = (double *)((long)(int)uVar1 + *(long *)(local_18 + 4));
          *local_18 = uVar1 + 8;
        }
        else {
          local_8d0 = *(double **)(local_18 + 2);
          *(double **)(local_18 + 2) = local_8d0 + 1;
        }
        adStack_838[local_1c] = *local_8d0;
        break;
      case '\t':
        uVar1 = local_18[1];
        if (uVar1 < 0xa1) {
          pdVar2 = (double *)((long)(int)uVar1 + *(long *)(local_18 + 4));
          local_18[1] = uVar1 + 0x10;
        }
        else {
          pdVar2 = *(double **)(local_18 + 2);
          *(double **)(local_18 + 2) = pdVar2 + 1;
        }
        *(float *)(adStack_838 + local_1c) = (float)*pdVar2;
        break;
      case '\n':
        uVar1 = local_18[1];
        if (uVar1 < 0xa1) {
          local_910 = (double *)((long)(int)uVar1 + *(long *)(local_18 + 4));
          local_18[1] = uVar1 + 0x10;
        }
        else {
          local_910 = *(double **)(local_18 + 2);
          *(double **)(local_18 + 2) = local_910 + 1;
        }
        adStack_838[local_1c] = *local_910;
        break;
      default:
        fprintf(_stderr,"do_push_args: unknown type\n");
        exit(1);
      }
    }
  }
  for (local_1c = 0; local_1c < local_20; local_1c = local_1c + 1) {
    local_83c = local_1c;
    if (local_24 != 0) {
      local_83c = (local_20 - local_1c) + -1;
    }
    if (local_30[local_83c].is_immediate == '\0') {
      (*local_8->j->push)(local_8,(int)local_30[local_83c].type,*(int *)(adStack_838 + local_83c));
    }
    else {
      switch(local_30[local_83c].type) {
      case '\0':
      case '\x02':
      case '\x04':
        (*local_8->j->pushi)(local_8,4,(long)*(int *)(adStack_838 + local_83c));
        break;
      case '\x01':
      case '\x03':
      case '\x05':
        (*local_8->j->pushi)(local_8,5,(long)*(undefined4 *)(adStack_838 + local_83c));
        break;
      case '\x06':
        (*local_8->j->pushi)(local_8,6,(long)adStack_838[local_83c]);
        break;
      case '\a':
        (*local_8->j->pushi)(local_8,7,(long)adStack_838[local_83c]);
        break;
      case '\b':
        (*local_8->j->pushpi)(local_8,8,(void *)adStack_838[local_83c]);
        break;
      case '\t':
        (*local_8->j->pushfi)(local_8,9,(double)*(float *)(adStack_838 + local_83c));
        break;
      case '\n':
        (*local_8->j->pushfi)(local_8,10,adStack_838[local_83c]);
        break;
      default:
        fprintf(_stderr,"do_push_args: unknown type\n");
        exit(1);
      }
    }
  }
  free(local_30);
  return;
}

Assistant:

static void
do_vararg_push(dill_stream s, const char* arg_str, va_list ap)
{
    int i, arg_count;
    int reverse = 0;
    arg_info_list args = translate_arg_str(arg_str, &arg_count);
    type_union value[256];

    dill_push_init(s);

    reverse = dill_do_reverse_vararg_push(s);

    for (i = 0; i < arg_count; i++) {
        if (!args[i].is_immediate) {
            value[i].i = va_arg(ap, int);
        } else {
            switch (args[i].type) {
            case DILL_UC:
            case DILL_US:
            case DILL_U:
                value[i].u = va_arg(ap, unsigned);
                break;
            case DILL_C:
            case DILL_S:
            case DILL_I:
                value[i].i = va_arg(ap, int);
                break;
            case DILL_L:
                value[i].l = va_arg(ap, long);
                break;
            case DILL_UL:
                value[i].ul = va_arg(ap, unsigned long);
                break;
            case DILL_P:
                value[i].p = va_arg(ap, void*);
                break;
            case DILL_F:
                value[i].f = (float)va_arg(ap, double);
                break;
            case DILL_D:
                value[i].d = va_arg(ap, double);
                break;
            default:
                fprintf(stderr, "do_push_args: unknown type\n");
                exit(1);
            }
        }
    }

    /* push all arguments */
    for (i = 0; i < arg_count; i++) {
        int arg = i;
        if (reverse) {
            arg = arg_count - i - 1;
        }
        if (!args[arg].is_immediate) {
            dill_push_arg(s, args[arg].type, value[arg].i);
        } else {
            switch (args[arg].type) {
            case DILL_UC:
            case DILL_US:
            case DILL_U:
                dill_push_argui(s, value[arg].u);
                break;
            case DILL_C:
            case DILL_S:
            case DILL_I:
                dill_push_argii(s, value[arg].i);
                break;
            case DILL_L:
                dill_push_argli(s, value[arg].l);
                break;
            case DILL_UL:
                dill_push_arguli(s, value[arg].ul);
                break;
            case DILL_P:
                dill_push_argpi(s, value[arg].p);
                break;
            case DILL_F:
                dill_push_argfi(s, value[arg].f);
                break;
            case DILL_D:
                dill_push_argdi(s, value[arg].d);
                break;
            default:
                fprintf(stderr, "do_push_args: unknown type\n");
                exit(1);
            }
        }
    }
    free(args);
}